

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

double __thiscall
baryonyx::itm::default_cost_type<long_double>::results
          (default_cost_type<long_double> *this,bit_array *x,double cost_constant)

{
  pointer poVar1;
  pointer poVar2;
  int iVar3;
  ulong uVar4;
  double local_28;
  
  poVar1 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar2 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_28 = cost_constant;
  for (uVar4 = 0; ((long)poVar1 - (long)poVar2 & 0xffffffff0U) != uVar4; uVar4 = uVar4 + 0x10) {
    iVar3 = bit_array::operator[]
                      (x,*(int *)((long)&((this->obj->elements).
                                          super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->variable_index
                                 + uVar4));
    if (iVar3 != 0) {
      local_28 = local_28 +
                 *(double *)
                  ((long)&((this->obj->elements).
                           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                           ._M_impl.super__Vector_impl_data._M_start)->factor + uVar4);
    }
  }
  return local_28;
}

Assistant:

double results(const bit_array& x, double cost_constant) const noexcept
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i)
            if (x[obj.elements[i].variable_index])
                cost_constant += obj.elements[i].factor;

        return cost_constant;
    }